

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O3

short bdf_atos_(char *s)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  byte *pbVar5;
  
  if ((s == (char *)0x0) || (cVar1 = *s, cVar1 == '\0')) {
    return 0;
  }
  bVar2 = s[cVar1 == '-'];
  if ((""[bVar2 >> 3] >> (bVar2 & 7) & 1) == 0) {
    sVar4 = 0;
  }
  else {
    pbVar5 = (byte *)(s + (cVar1 == '-'));
    sVar4 = 0;
    do {
      pbVar5 = pbVar5 + 1;
      if (0xcca < sVar4) {
        sVar4 = 0x7fff;
        break;
      }
      sVar4 = (ushort)""[(char)bVar2] + sVar4 * 10;
      bVar2 = *pbVar5;
    } while ((""[bVar2 >> 3] >> (bVar2 & 7) & 1) != 0);
  }
  sVar3 = -sVar4;
  if (cVar1 != '-') {
    sVar3 = sVar4;
  }
  return sVar3;
}

Assistant:

static short
  bdf_atos_( const char*  s )
  {
    short  v, neg;


    if ( s == NULL || *s == 0 )
      return 0;

    /* Check for a minus. */
    neg = 0;
    if ( *s == '-' )
    {
      s++;
      neg = 1;
    }

    for ( v = 0; sbitset( ddigits, *s ); s++ )
    {
      if ( v < ( SHRT_MAX - 9 ) / 10 )
        v = (short)( v * 10 + a2i[(int)*s] );
      else
      {
        v = SHRT_MAX;
        break;
      }
    }

    return (short)( ( !neg ) ? v : -v );
  }